

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall
enact::Options::Options
          (Options *this,string *filename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *programArgs,
          unordered_set<enact::Flag,_std::hash<enact::Flag>,_std::equal_to<enact::Flag>,_std::allocator<enact::Flag>_>
          *flags)

{
  pointer pbVar1;
  long lVar2;
  initializer_list<enact::Flag> __l;
  undefined1 local_2bc;
  undefined1 local_2bb;
  undefined1 local_2ba;
  allocator_type local_2b9;
  _Vector_base<enact::Flag,_std::allocator<enact::Flag>_> local_2b8;
  Flag local_298 [6];
  _Bind<void_(enact::Options::*(enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>))(std::vector<enact::Flag,_std::allocator<enact::Flag>_>)>
  local_280;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_250;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_230;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_210;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_1f0;
  _Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)> local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_1b0 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_70;
  
  std::__cxx11::string::string((string *)this,(string *)filename);
  pbVar1 = (programArgs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_programArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (programArgs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_programArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (this->m_programArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (programArgs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (programArgs->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (programArgs->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (programArgs->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<enact::Flag,_enact::Flag,_std::allocator<enact::Flag>,_std::__detail::_Identity,_std::equal_to<enact::Flag>,_std::hash<enact::Flag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&(this->m_flags)._M_h,&flags->_M_h);
  local_1d0._M_f = (offset_in_Options_to_subr)enableFlag;
  local_1d0._8_8_ = 0;
  local_1d0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_PRINT_AST;
  local_1d0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[18],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (local_1b0,(char (*) [18])"--debug-print-ast",&local_1d0);
  local_1f0._M_f = (offset_in_Options_to_subr)enableFlag;
  local_1f0._8_8_ = 0;
  local_1f0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_DISASSEMBLE_CHUNK;
  local_1f0._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[26],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (local_1b0 + 1,(char (*) [26])"--debug-disassemble-chunk",&local_1f0);
  local_210._M_f = (offset_in_Options_to_subr)enableFlag;
  local_210._8_8_ = 0;
  local_210._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_TRACE_EXECUTION;
  local_210._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[24],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (local_1b0 + 2,(char (*) [24])"--debug-trace-execution",&local_210);
  local_230._M_f = (offset_in_Options_to_subr)enableFlag;
  local_230._8_8_ = 0;
  local_230._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_STRESS_GC;
  local_230._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[18],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (local_1b0 + 3,(char (*) [18])"--debug-stress-gc",&local_230);
  local_250._M_f = (offset_in_Options_to_subr)enableFlag;
  local_250._8_8_ = 0;
  local_250._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Tuple_impl<1UL,_enact::Flag>.super__Head_base<1UL,_enact::Flag,_false>._M_head_impl =
       (_Head_base<1UL,_enact::Flag,_false>)DEBUG_LOG_GC;
  local_250._M_bound_args.super__Tuple_impl<0UL,_enact::Options_*,_enact::Flag>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[15],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_b0,(char (*) [15])"--debug-log-gc",&local_250);
  local_298[0] = DEBUG_PRINT_AST;
  local_298[1] = DEBUG_DISASSEMBLE_CHUNK;
  local_298[2] = DEBUG_TRACE_EXECUTION;
  local_298[3] = DEBUG_STRESS_GC;
  local_298[4] = 4;
  __l._M_len = 5;
  __l._M_array = local_298;
  std::vector<enact::Flag,_std::allocator<enact::Flag>_>::vector
            ((vector<enact::Flag,_std::allocator<enact::Flag>_> *)&local_2b8,__l,&local_2b9);
  local_280._M_f = (offset_in_Options_to_subr)enableFlags;
  local_280._8_8_ = 0;
  local_280._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>._M_head_impl.
  super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.super__Vector_impl_data.
  _M_start = local_2b8._M_impl.super__Vector_impl_data._M_start;
  local_280._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>._M_head_impl.
  super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2b8._M_impl.super__Vector_impl_data._M_finish;
  local_280._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Tuple_impl<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<1UL,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>,_false>._M_head_impl.
  super__Vector_base<enact::Flag,_std::allocator<enact::Flag>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280._M_bound_args.
  super__Tuple_impl<0UL,_enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>_>.
  super__Head_base<0UL,_enact::Options_*,_false>._M_head_impl = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[8],_std::_Bind<void_(enact::Options::*(enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>))(std::vector<enact::Flag,_std::allocator<enact::Flag>_>)>,_true>
            (&local_70,(char (*) [8])"--debug",&local_280);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void()>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void()>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::function<void()>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void()>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void()>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->m_parseTable,local_1b0,&stack0xffffffffffffffd0,0,&local_2ba,&local_2bb,
             &local_2bc);
  lVar2 = 0x140;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
             *)((long)&local_1b0[0].first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  std::_Vector_base<enact::Flag,_std::allocator<enact::Flag>_>::~_Vector_base
            ((_Vector_base<enact::Flag,_std::allocator<enact::Flag>_> *)&local_280._M_bound_args);
  std::_Vector_base<enact::Flag,_std::allocator<enact::Flag>_>::~_Vector_base(&local_2b8);
  return;
}

Assistant:

Options::Options(std::string filename, std::vector<std::string> programArgs, std::unordered_set<Flag> flags) :
            m_filename{std::move(filename)},
            m_programArgs{std::move(programArgs)},
            m_flags{std::move(flags)} {
    }